

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O0

void testReadScans(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer puVar5;
  short *psVar6;
  float *pfVar7;
  exr_result_t _test_rv_32;
  exr_result_t _test_rv_31;
  exr_result_t _test_rv_30;
  exr_result_t _test_rv_29;
  exr_result_t _test_rv_28;
  float *curz;
  uint16_t *curr;
  exr_result_t _test_rv_27;
  exr_result_t _test_rv_26;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> zptr;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> rptr;
  exr_result_t _test_rv_25;
  exr_decode_pipeline_t decoder;
  exr_result_t _test_rv_24;
  uint64_t pchunksz;
  exr_result_t _test_rv_23;
  exr_result_t _test_rv_22;
  exr_result_t _test_rv_21;
  exr_result_t _test_rv_20;
  exr_result_t _test_rv_19;
  exr_result_t _test_rv_18;
  exr_result_t _test_rv_17;
  exr_result_t _test_rv_16;
  exr_chunk_info_t cinfo;
  exr_result_t _test_rv_15;
  exr_result_t _test_rv_14;
  exr_result_t _test_rv_13;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_attr_box2i_t dw;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  int32_t ccount;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  string fn;
  exr_context_t f;
  char *in_stack_fffffffffffff2e8;
  uchar *__p;
  ostream *in_stack_fffffffffffff2f0;
  char *in_stack_fffffffffffff2f8;
  char *in_stack_fffffffffffff300;
  allocator<char> *in_stack_fffffffffffff320;
  char *in_stack_fffffffffffff328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff330;
  undefined8 *local_360;
  short local_358;
  long local_300;
  long local_2f0;
  int local_17c;
  long local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  uchar local_150 [22];
  char local_13a;
  char local_139;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined1 local_f8 [4];
  int local_f4;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  code *pcStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  allocator<char> local_31;
  string local_30 [32];
  undefined8 local_10 [2];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328,in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(&local_31);
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_58 = 0;
  local_b8 = 0x68;
  uStack_60 = 0xbf800000fffffffe;
  pcStack_b0 = err_cb;
  std::__cxx11::string::operator+=(local_30,"v1.7.test.interleaved.exr");
  uVar2 = std::__cxx11::string::c_str();
  local_bc = exr_start_read(local_10,uVar2,&local_b8);
  if (local_bc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_bc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_c4 = exr_get_chunk_count(0,0,&local_c0);
  if (local_c4 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_c8 = exr_get_chunk_count(local_10[0],0xffffffff,&local_c0);
  if (local_c8 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_cc = exr_get_chunk_count(local_10[0],0xb,&local_c0);
  if (local_cc != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_cc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_cc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_d0 = exr_get_chunk_count(local_10[0],0,0);
  if (local_d0 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_d4 = exr_get_chunk_count(local_10[0],0,&local_c0);
  if (local_d4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_d8 = exr_get_scanlines_per_chunk(0,0,&local_c0);
  if (local_d8 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_dc = exr_get_scanlines_per_chunk(local_10[0],0xffffffff,&local_c0);
  if (local_dc != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_dc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_dc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_e0 = exr_get_scanlines_per_chunk(local_10[0],0xb,&local_c0);
  if (local_e0 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_e4 = exr_get_scanlines_per_chunk(local_10[0],0,0);
  if (local_e4 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_e8 = exr_get_scanlines_per_chunk(local_10[0],0,&local_c0);
  if (local_e8 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  if (local_c0 != 1) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_fc = exr_get_data_window(0,0,local_f8);
  if (local_fc != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_fc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_fc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_100 = exr_get_data_window(local_10[0],0xffffffff,local_f8);
  if (local_100 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_100);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_100);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_104 = exr_get_data_window(local_10[0],1,local_f8);
  if (local_104 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_104);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_104);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_108 = exr_get_data_window(local_10[0],0,0);
  if (local_108 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_108);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_108);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_10c = exr_get_data_window(local_10[0],0,local_f8);
  if (local_10c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_10c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_154 = exr_read_scanline_chunk_info(0,0,0x2a,local_150);
  if (local_154 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_154);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_154);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_158 = exr_read_scanline_chunk_info(local_10[0],0xffffffff,0x2a,local_150);
  if (local_158 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_158);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_158);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_15c = exr_read_scanline_chunk_info(local_10[0],1,0x2a,local_150);
  if (local_15c != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_15c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_15c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  local_160 = exr_read_scanline_chunk_info(local_10[0],0,0x2a,0);
  if (local_160 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_160);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_160);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),in_stack_fffffffffffff2e8);
  }
  __p = local_150;
  local_164 = exr_read_tile_chunk_info(local_10[0],0,4,2,0);
  if (local_164 != 0x13) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_164);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_164);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x13);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0x13);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  local_168 = exr_read_scanline_chunk_info(local_10[0],0,local_f4 + -1,local_150);
  if (local_168 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_168);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_168);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  local_16c = exr_read_scanline_chunk_info(local_10[0],0,local_ec + 1,local_150);
  if (local_16c != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_16c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_16c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  local_170 = exr_read_scanline_chunk_info(local_10[0],0,local_f4,local_150);
  if (local_170 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_170);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_170);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  local_178 = 0;
  local_17c = exr_get_chunk_unpacked_size(local_10[0],0,&local_178);
  if (local_17c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_17c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_17c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_13a != '\0') {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_139 != '\0') {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_130 != local_178) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_128 != local_178) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_120 != 0) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_118 != 0) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_initialize(local_10[0],0,local_150,&local_360);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_358 != 2) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  iVar1 = strcmp((char *)*local_360,"R");
  if (iVar1 != 0) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(char *)((long)local_360 + 0x19) != '\x02') {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(short *)((long)local_360 + 0x1a) != 1) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(int *)((long)local_360 + 0xc) != 0xb2) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(int *)(local_360 + 1) != 1) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(int *)(local_360 + 2) != 1) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(int *)((long)local_360 + 0x14) != 1) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  iVar1 = strcmp((char *)local_360[6],"Z");
  if (iVar1 != 0) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(char *)((long)local_360 + 0x49) != '\x04') {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(short *)((long)local_360 + 0x4a) != 2) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(int *)((long)local_360 + 0x3c) != 0xb2) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(int *)(local_360 + 7) != 1) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(int *)(local_360 + 8) != 1) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (*(int *)((long)local_360 + 0x44) != 1) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  operator_new__(0x164);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff2f0,__p);
  operator_new__(0x2c8);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff2f0,__p);
  puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff2f0);
  memset(puVar5,0xff,0x164);
  puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff2f0);
  memset(puVar5,0xff,0x2c8);
  puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff2f0);
  local_360[5] = puVar5;
  *(undefined4 *)(local_360 + 4) = 2;
  *(undefined4 *)((long)local_360 + 0x24) = 0x164;
  puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff2f0);
  local_360[0xb] = puVar5;
  *(undefined4 *)(local_360 + 10) = 4;
  *(undefined4 *)((long)local_360 + 0x54) = 0x2c8;
  iVar1 = exr_decoding_choose_default_routines(local_10[0],0,&local_360);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_run(local_10[0],0,&local_360);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_300 != 0) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (local_2f0 != 0) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  psVar6 = (short *)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *
                               )in_stack_fffffffffffff2f0);
  pfVar7 = (float *)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *
                               )in_stack_fffffffffffff2f0);
  if (*psVar6 != 0) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  if (1e-06 <= ABS(*pfVar7 - 0.101991)) {
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_destroy(local_10[0],&local_360);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_initialize(local_10[0],0,local_150,&local_360);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  operator_new__(0x2c8);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::reset<unsigned_char*,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff2f0,__p);
  puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff2f0);
  local_360[5] = puVar5;
  *(undefined4 *)(local_360 + 4) = 4;
  *(undefined4 *)((long)local_360 + 0x24) = 0x2c8;
  *(undefined2 *)((long)local_360 + 0x1c) = 4;
  *(undefined2 *)((long)local_360 + 0x1e) = 2;
  puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff2f0);
  local_360[0xb] = puVar5;
  *(undefined4 *)(local_360 + 10) = 4;
  *(undefined4 *)((long)local_360 + 0x54) = 0x2c8;
  iVar1 = exr_decoding_choose_default_routines(local_10[0],0,&local_360);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_run(local_10[0],0,&local_360);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                   (uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_destroy(local_10[0],&local_360);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    in_stack_fffffffffffff2f0 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(in_stack_fffffffffffff2f0,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)poVar3,pcVar4,(uint)((ulong)in_stack_fffffffffffff2f0 >> 0x20),
                   (char *)__p);
  }
  exr_finish(local_10);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff2f0);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testReadScans (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

    int32_t ccount;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_chunk_count (NULL, 0, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_chunk_count (f, -1, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_chunk_count (f, 11, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_chunk_count (f, 0, NULL));
    EXRCORE_TEST_RVAL (exr_get_chunk_count (f, 0, &ccount));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_scanlines_per_chunk (NULL, 0, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_scanlines_per_chunk (f, -1, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_scanlines_per_chunk (f, 11, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_scanlines_per_chunk (f, 0, NULL));
    EXRCORE_TEST_RVAL (exr_get_scanlines_per_chunk (f, 0, &ccount));
    EXRCORE_TEST (ccount == 1);

    exr_attr_box2i_t dw;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_data_window (NULL, 0, &dw));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_data_window (f, -1, &dw));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_data_window (f, 1, &dw));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_data_window (f, 0, NULL));
    EXRCORE_TEST_RVAL (exr_get_data_window (f, 0, &dw));

    exr_chunk_info_t cinfo;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_read_scanline_chunk_info (NULL, 0, 42, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_read_scanline_chunk_info (f, -1, 42, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_read_scanline_chunk_info (f, 1, 42, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_scanline_chunk_info (f, 0, 42, NULL));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_TILE_SCAN_MIXEDAPI,
        exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_scanline_chunk_info (f, 0, dw.min.y - 1, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_scanline_chunk_info (f, 0, dw.max.y + 1, &cinfo));
    EXRCORE_TEST_RVAL (exr_read_scanline_chunk_info (f, 0, dw.min.y, &cinfo));

    uint64_t pchunksz = 0;
    EXRCORE_TEST_RVAL (exr_get_chunk_unpacked_size (f, 0, &pchunksz));
    EXRCORE_TEST (cinfo.type == EXR_STORAGE_SCANLINE);
    EXRCORE_TEST (cinfo.compression == EXR_COMPRESSION_NONE);
    EXRCORE_TEST (cinfo.packed_size == pchunksz);
    EXRCORE_TEST (cinfo.unpacked_size == pchunksz);
    EXRCORE_TEST (cinfo.sample_count_data_offset == 0);
    EXRCORE_TEST (cinfo.sample_count_table_size == 0);

    exr_decode_pipeline_t decoder;
    EXRCORE_TEST_RVAL (exr_decoding_initialize (f, 0, &cinfo, &decoder));

    EXRCORE_TEST (decoder.channel_count == 2);
    EXRCORE_TEST (!strcmp (decoder.channels[0].channel_name, "R"));
    EXRCORE_TEST (decoder.channels[0].bytes_per_element == 2);
    EXRCORE_TEST (decoder.channels[0].data_type == EXR_PIXEL_HALF);
    EXRCORE_TEST (decoder.channels[0].width == 178);
    EXRCORE_TEST (decoder.channels[0].height == 1);
    EXRCORE_TEST (decoder.channels[0].x_samples == 1);
    EXRCORE_TEST (decoder.channels[0].y_samples == 1);
    EXRCORE_TEST (!strcmp (decoder.channels[1].channel_name, "Z"));
    EXRCORE_TEST (decoder.channels[1].bytes_per_element == 4);
    EXRCORE_TEST (decoder.channels[1].data_type == EXR_PIXEL_FLOAT);
    EXRCORE_TEST (decoder.channels[1].width == 178);
    EXRCORE_TEST (decoder.channels[1].height == 1);
    EXRCORE_TEST (decoder.channels[1].x_samples == 1);
    EXRCORE_TEST (decoder.channels[1].y_samples == 1);

    std::unique_ptr<uint8_t[]> rptr{new uint8_t[178 * 2]};
    std::unique_ptr<uint8_t[]> zptr{new uint8_t[178 * 4]};
    memset (rptr.get (), -1, 178 * 2);
    memset (zptr.get (), -1, 178 * 4);
    decoder.channels[0].decode_to_ptr     = rptr.get ();
    decoder.channels[0].user_pixel_stride = 2;
    decoder.channels[0].user_line_stride  = 2 * 178;
    decoder.channels[1].decode_to_ptr     = zptr.get ();
    decoder.channels[1].user_pixel_stride = 4;
    decoder.channels[1].user_line_stride  = 4 * 178;

    EXRCORE_TEST_RVAL (exr_decoding_choose_default_routines (f, 0, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

    // it is compression: none
    EXRCORE_TEST (decoder.packed_buffer == NULL);
    // it is compression: none
    EXRCORE_TEST (decoder.unpacked_buffer == NULL);
    /* TODO: add actual comparison against C++ library */
    const uint16_t* curr = reinterpret_cast<const uint16_t*> (rptr.get ());
    const float*    curz = reinterpret_cast<const float*> (zptr.get ());
    EXRCORE_TEST (*curr == 0);
    EXRCORE_TEST (fabsf (*curz - 0.101991f) < 0.000001f);

    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_initialize (f, 0, &cinfo, &decoder));
    rptr.reset (new uint8_t[178 * 4]);
    decoder.channels[0].decode_to_ptr          = rptr.get ();
    decoder.channels[0].user_pixel_stride      = 4;
    decoder.channels[0].user_line_stride       = 4 * 178;
    decoder.channels[0].user_bytes_per_element = 4;
    decoder.channels[0].user_data_type         = EXR_PIXEL_FLOAT;
    decoder.channels[1].decode_to_ptr          = zptr.get ();
    decoder.channels[1].user_pixel_stride      = 4;
    decoder.channels[1].user_line_stride       = 4 * 178;

    EXRCORE_TEST_RVAL (exr_decoding_choose_default_routines (f, 0, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));

    exr_finish (&f);
}